

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O2

void search_switchable(RestorationTileLimits *limits,int rest_unit_idx,void *priv,int32_t *tmpbuf,
                      RestorationLineBuffers *rlbs,aom_internal_error_info *error_info)

{
  SgrprojInfo *ref_sgrproj_info;
  WienerInfo *wiener_info;
  SgrprojInfo *sgrproj_info;
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  RestorationType r;
  ulong uVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  long lStack_70;
  
  lVar1 = *(long *)((long)priv + 0x18);
  iVar7 = *(int *)((long)priv + 0x20);
  wiener_info = (WienerInfo *)(*(long *)((long)priv + 0x30) + (long)rest_unit_idx * 0x40);
  sgrproj_info = (SgrprojInfo *)(*(long *)((long)priv + 0x30) + 0x20 + (long)rest_unit_idx * 0x40);
  ref_sgrproj_info = (SgrprojInfo *)((long)priv + 0x110);
  dVar13 = 0.0;
  uVar9 = 0;
  uVar8 = 0;
  lVar10 = 0;
  do {
    if (uVar9 == 3) {
      iVar7 = (int)uVar8;
      *(int *)(wiener_info[1].hfilter + 2) = iVar7;
      *(long *)((long)priv + 0x98) =
           *(long *)((long)priv + 0x98) + *(long *)((long)priv + uVar8 * 8 + 0x60);
      *(long *)((long)priv + 0xb8) = *(long *)((long)priv + 0xb8) + lVar10;
      if (iVar7 == 1) {
        uVar2 = *(undefined8 *)wiener_info->vfilter;
        uVar3 = *(undefined8 *)(wiener_info->vfilter + 4);
        uVar4 = *(undefined8 *)(wiener_info->hfilter + 4);
        *(undefined8 *)((long)priv + 0x100) = *(undefined8 *)wiener_info->hfilter;
        *(undefined8 *)((long)priv + 0x108) = uVar4;
        *(undefined8 *)((WienerInfo *)((long)priv + 0xf0))->vfilter = uVar2;
        *(undefined8 *)((long)priv + 0xf8) = uVar3;
      }
      else if (iVar7 == 2) {
        *(int *)((long)priv + 0x118) = sgrproj_info->xqd[1];
        iVar7 = sgrproj_info->xqd[0];
        ref_sgrproj_info->ep = sgrproj_info->ep;
        ref_sgrproj_info->xqd[0] = iVar7;
      }
      return;
    }
    if (uVar9 == 0) {
      lVar11 = *(long *)((long)priv + 0x60);
      lStack_70 = 0;
      lVar6 = 0;
LAB_001df98a:
      lVar6 = (long)*(int *)(lVar1 + 0xb930 + lStack_70 * 4) + lVar6 * 0x200;
      dVar12 = (double)(lVar11 >>
                       (*(char *)(*(long *)(*(long *)((long)priv + 0x10) + 0x6088) + 0x48) * '\x02'
                        - 0x10U & 0x3f)) * 128.0 +
               (double)*(int *)(lVar1 + 0x4218) * (double)(lVar6 >> 4) * 0.001953125;
      if ((uVar9 == 2) && (sgrproj_info->ep < 10)) {
        dVar12 = dVar12 * ((double)*(int *)(*(long *)((long)priv + 0x38) + 0x14) * 0.01 + 1.0);
      }
      if (dVar12 < dVar13 || uVar9 == 0) {
        uVar8 = uVar9 & 0xffffffff;
        lVar10 = lVar6;
        dVar13 = dVar12;
      }
    }
    else {
      lVar11 = *(long *)((long)priv + uVar9 * 8 + 0x60);
      if (lVar11 <= *(long *)((long)priv + 0x60)) {
        if (uVar9 == 2) {
          iVar5 = count_sgrproj_bits(sgrproj_info,ref_sgrproj_info);
          lStack_70 = 2;
        }
        else {
          iVar5 = count_wiener_bits((uint)(iVar7 == 0) * 2 + 5,wiener_info,
                                    (WienerInfo *)((long)priv + 0xf0));
          lStack_70 = 1;
        }
        lVar6 = (long)iVar5;
        goto LAB_001df98a;
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

static inline void search_switchable(
    const RestorationTileLimits *limits, int rest_unit_idx, void *priv,
    int32_t *tmpbuf, RestorationLineBuffers *rlbs,
    struct aom_internal_error_info *error_info) {
  (void)limits;
  (void)tmpbuf;
  (void)rlbs;
  (void)error_info;
  RestSearchCtxt *rsc = (RestSearchCtxt *)priv;
  RestUnitSearchInfo *rusi = &rsc->rusi[rest_unit_idx];

  const MACROBLOCK *const x = rsc->x;

  const int wiener_win =
      (rsc->plane == AOM_PLANE_Y) ? WIENER_WIN : WIENER_WIN_CHROMA;

  double best_cost = 0;
  int64_t best_bits = 0;
  RestorationType best_rtype = RESTORE_NONE;

  for (RestorationType r = 0; r < RESTORE_SWITCHABLE_TYPES; ++r) {
    // If this restoration mode was skipped, or could not find a solution
    // that was better than RESTORE_NONE, then we can't select it here either.
    //
    // Note: It is possible for the restoration search functions to find a
    // filter which is better than RESTORE_NONE when looking purely at SSE, but
    // for it to be rejected overall due to its rate cost. In this case, there
    // is a chance that it may be have a lower rate cost when looking at
    // RESTORE_SWITCHABLE, and so it might be acceptable here.
    //
    // Therefore we prune based on SSE, rather than on whether or not the
    // previous search function selected this mode.
    if (r > RESTORE_NONE) {
      if (rsc->sse[r] > rsc->sse[RESTORE_NONE]) continue;
    }

    const int64_t sse = rsc->sse[r];
    int64_t coeff_pcost = 0;
    switch (r) {
      case RESTORE_NONE: coeff_pcost = 0; break;
      case RESTORE_WIENER:
        coeff_pcost = count_wiener_bits(wiener_win, &rusi->wiener,
                                        &rsc->switchable_ref_wiener);
        break;
      case RESTORE_SGRPROJ:
        coeff_pcost =
            count_sgrproj_bits(&rusi->sgrproj, &rsc->switchable_ref_sgrproj);
        break;
      default: assert(0); break;
    }
    const int64_t coeff_bits = coeff_pcost << AV1_PROB_COST_SHIFT;
    const int64_t bits = x->mode_costs.switchable_restore_cost[r] + coeff_bits;
    double cost = RDCOST_DBL_WITH_NATIVE_BD_DIST(
        x->rdmult, bits >> 4, sse, rsc->cm->seq_params->bit_depth);
    if (r == RESTORE_SGRPROJ && rusi->sgrproj.ep < 10)
      cost *= (1 + DUAL_SGR_PENALTY_MULT * rsc->lpf_sf->dual_sgr_penalty_level);
    if (r == 0 || cost < best_cost) {
      best_cost = cost;
      best_bits = bits;
      best_rtype = r;
    }
  }

  rusi->best_rtype[RESTORE_SWITCHABLE - 1] = best_rtype;

#if DEBUG_LR_COSTING
  // Store ref params for later checking
  lr_ref_params[RESTORE_SWITCHABLE][rsc->plane][rest_unit_idx].wiener_info =
      rsc->switchable_ref_wiener;
  lr_ref_params[RESTORE_SWITCHABLE][rsc->plane][rest_unit_idx].sgrproj_info =
      rsc->switchable_ref_sgrproj;
#endif  // DEBUG_LR_COSTING

  rsc->total_sse[RESTORE_SWITCHABLE] += rsc->sse[best_rtype];
  rsc->total_bits[RESTORE_SWITCHABLE] += best_bits;
  if (best_rtype == RESTORE_WIENER) rsc->switchable_ref_wiener = rusi->wiener;
  if (best_rtype == RESTORE_SGRPROJ)
    rsc->switchable_ref_sgrproj = rusi->sgrproj;
}